

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

bool __thiscall
QMainWindowLayoutState::checkFormat(QMainWindowLayoutState *this,QDataStream *stream)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QDataStream *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QList<QDockWidget_*> dockWidgets_1;
  QRect geom;
  QList<QDockWidget_*> dockWidgets;
  QList<QToolBar_*> toolBars;
  uchar marker;
  QDockAreaLayoutInfo info;
  quint8 *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined4 in_stack_ffffffffffffff0c;
  undefined1 testing;
  uint uVar4;
  undefined7 in_stack_ffffffffffffff20;
  byte in_stack_ffffffffffffff27;
  QWidget *in_stack_ffffffffffffff30;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *in_stack_ffffffffffffff50;
  QList<QToolBar_*> *in_stack_ffffffffffffff58;
  QDataStream *in_stack_ffffffffffffff60;
  QToolBarAreaLayout *this_00;
  undefined1 *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar5;
  QDataStream *in_stack_ffffffffffffff88;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    testing = (undefined1)((uint)in_stack_ffffffffffffff0c >> 0x18);
    bVar2 = QDataStream::atEnd();
    if (((bVar2 ^ 0xff) & 1) == 0) break;
    uVar5 = 0xaa;
    QDataStream::operator>>
              ((QDataStream *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    switch(uVar5) {
    case 0xf9:
      local_c0 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      QRect::QRect((QRect *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      ::operator>>(in_RSI,(QRect *)&local_c0);
      memset(&stack0xffffffffffffff88,0xaa,0x70);
      QDockAreaLayoutInfo::QDockAreaLayoutInfo
                ((QDockAreaLayoutInfo *)
                 CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      in_stack_ffffffffffffff30 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      allMyDockWidgets((QWidget *)&DAT_aaaaaaaaaaaaaaaa);
      bVar3 = QDockAreaLayoutInfo::restoreState
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                         (QList<QDockWidget_*> *)CONCAT17(uVar5,in_stack_ffffffffffffff80),
                         SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0));
      if (!bVar3) {
        in_stack_ffffffffffffff27 = 0;
      }
      uVar4 = (uint)!bVar3;
      QList<QDockWidget_*>::~QList((QList<QDockWidget_*> *)0x5f4e57);
      QDockAreaLayoutInfo::~QDockAreaLayoutInfo
                ((QDockAreaLayoutInfo *)
                 CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      if (uVar4 == 0) goto LAB_005f4e79;
      goto LAB_005f4e83;
    default:
      in_stack_ffffffffffffff27 = 0;
      goto LAB_005f4e83;
    case 0xfc:
    case 0xfe:
      this_00 = (QToolBarAreaLayout *)&DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffff78 = &DAT_aaaaaaaaaaaaaaaa;
      findChildrenHelper<QToolBar*>(in_RDI);
      bVar3 = QToolBarAreaLayout::restoreState
                        (this_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         (uchar)((ulong)in_stack_ffffffffffffff50 >> 0x38),
                         SUB81((ulong)in_stack_ffffffffffffff50 >> 0x30,0));
      if (!bVar3) {
        in_stack_ffffffffffffff27 = 0;
      }
      uVar4 = (uint)!bVar3;
      QList<QToolBar_*>::~QList((QList<QToolBar_*> *)0x5f4ce6);
      break;
    case 0xfd:
      in_stack_ffffffffffffff50 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffff58 = (QList<QToolBar_*> *)&DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffff60 = (QDataStream *)&DAT_aaaaaaaaaaaaaaaa;
      allMyDockWidgets(in_stack_ffffffffffffff30);
      bVar3 = QDockAreaLayout::restoreState
                        ((QDockAreaLayout *)
                         CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                         (QDataStream *)in_RDI,(QList<QDockWidget_*> *)in_RSI,(bool)testing);
      if (!bVar3) {
        in_stack_ffffffffffffff27 = 0;
      }
      uVar4 = (uint)!bVar3;
      QList<QDockWidget_*>::~QList((QList<QDockWidget_*> *)0x5f4d76);
    }
    if (uVar4 != 0) goto LAB_005f4e83;
LAB_005f4e79:
    in_stack_ffffffffffffff0c = 0;
  }
  in_stack_ffffffffffffff27 = 1;
LAB_005f4e83:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(in_stack_ffffffffffffff27 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayoutState::checkFormat(QDataStream &stream)
{
    while (!stream.atEnd()) {
        uchar marker;
        stream >> marker;
        switch(marker)
        {
#if QT_CONFIG(toolbar)
            case QToolBarAreaLayout::ToolBarStateMarker:
            case QToolBarAreaLayout::ToolBarStateMarkerEx:
                {
                    QList<QToolBar *> toolBars = findChildrenHelper<QToolBar*>(mainWindow);
                    if (!toolBarAreaLayout.restoreState(stream, toolBars, marker, true /*testing*/)) {
                            return false;
                    }
                }
                break;
#endif // QT_CONFIG(toolbar)

#if QT_CONFIG(dockwidget)
            case QDockAreaLayout::DockWidgetStateMarker:
                {
                    const auto dockWidgets = allMyDockWidgets(mainWindow);
                    if (!dockAreaLayout.restoreState(stream, dockWidgets, true /*testing*/)) {
                        return false;
                    }
                }
                break;
#if QT_CONFIG(tabbar)
            case QDockAreaLayout::FloatingDockWidgetTabMarker:
                {
                    QRect geom;
                    stream >> geom;
                    QDockAreaLayoutInfo info;
                    auto dockWidgets = allMyDockWidgets(mainWindow);
                    if (!info.restoreState(stream, dockWidgets, true /* testing*/))
                        return false;
                }
                break;
#endif // QT_CONFIG(tabbar)
#endif // QT_CONFIG(dockwidget)
            default:
                //there was an error during the parsing
                return false;
        }// switch
    } //while

    //everything went fine: it must be a pre-4.3 saved state
    return true;
}